

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Header>::moveAppend(QGenericArrayOps<Header> *this,Header *b,Header *e)

{
  __index_type _Var1;
  Header *pHVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  long lVar6;
  long in_FS_OFFSET;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((b != e) && (b < e)) {
    pHVar2 = (this->super_QArrayDataPointer<Header>).ptr;
    lVar6 = (this->super_QArrayDataPointer<Header>).size;
    do {
      local_40.__lhs =
           (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar2 + lVar6);
      *(__index_type *)
       ((long)&pHVar2[lVar6].name.data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      _Var1 = *(__index_type *)
               ((long)&(b->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>
                       .super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
      *(__index_type *)
       ((long)&pHVar2[lVar6].name.data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = _Var1;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr[(long)(char)_Var1 + 1]._M_data)
                (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)b);
      pDVar3 = (b->value).d.d;
      (b->value).d.d = (Data *)0x0;
      pHVar2[lVar6].value.d.d = pDVar3;
      pcVar4 = (b->value).d.ptr;
      (b->value).d.ptr = (char *)0x0;
      pHVar2[lVar6].value.d.ptr = pcVar4;
      qVar5 = (b->value).d.size;
      (b->value).d.size = 0;
      pHVar2[lVar6].value.d.size = qVar5;
      b = b + 1;
      lVar6 = (this->super_QArrayDataPointer<Header>).size + 1;
      (this->super_QArrayDataPointer<Header>).size = lVar6;
    } while (b < e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }